

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O3

int __thiscall FluidSynthMIDIDevice::LoadPatchSets(FluidSynthMIDIDevice *this,char *patches)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  FString path;
  FString local_48;
  char *local_40;
  FString local_38;
  
  local_40 = strdup(patches);
  if (local_40 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    pcVar2 = strtok(local_40,":");
    if (pcVar2 == (char *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        local_48.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        NicePath((char *)&local_38);
        FString::operator=(&local_48,&local_38);
        FString::~FString(&local_38);
        if (FluidSynthModule.handle == (void *)0x0) {
          __assert_fail("Module.IsLoaded()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                        ,0xd2,
                        "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, const char *, int)>::operator int (*)(fluid_synth_t *, const char *, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, const char *, int)]"
                       );
        }
        iVar1 = (*(code *)fluid_synth_sfload.proc.Call)(this->FluidSynth,local_48.Chars,iVar3 == 0);
        if (iVar1 == -1) {
          DPrintf(1,"Failed to load patch set %s.\n",pcVar2);
        }
        else {
          DPrintf(3,"Loaded patch set %s.\n",pcVar2);
          iVar3 = iVar3 + 1;
        }
        pcVar2 = strtok((char *)0x0,":");
        FString::~FString(&local_48);
      } while (pcVar2 != (char *)0x0);
    }
    free(local_40);
  }
  return iVar3;
}

Assistant:

int FluidSynthMIDIDevice::LoadPatchSets(const char *patches)
{
	int count;
	char *wpatches = strdup(patches);
	char *tok;
#ifdef _WIN32
	const char *const delim = ";";
#else
	const char *const delim = ":";
#endif

	if (wpatches == NULL)
	{
		return 0;
	}
	tok = strtok(wpatches, delim);
	count = 0;
	while (tok != NULL)
	{
		FString path;
#ifdef _WIN32
		// If the path does not contain any path separators, automatically
		// prepend $PROGDIR to the path.
		if (strcspn(tok, ":/\\") == strlen(tok))
		{
			path << "$PROGDIR/" << tok;
			path = NicePath(path);
		}
		else
#endif
		{
			path = NicePath(tok);
		}
		if (FLUID_FAILED != fluid_synth_sfload(FluidSynth, path, count == 0))
		{
			DPrintf(DMSG_NOTIFY, "Loaded patch set %s.\n", tok);
			count++;
		}
		else
		{
			DPrintf(DMSG_ERROR, "Failed to load patch set %s.\n", tok);
		}
		tok = strtok(NULL, delim);
	}
	free(wpatches);
	return count;
}